

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# encode_json.hpp
# Opt level: O0

void jsoncons::
     encode_json<(anonymous_namespace)::ns::Project<std::unordered_set<(anonymous_namespace)::ns::Value,(anonymous_namespace)::ns::ValueHash,std::equal_to<(anonymous_namespace)::ns::Value>,std::allocator<(anonymous_namespace)::ns::Value>>>,char>
               (Project<std::unordered_set<(anonymous_namespace)::ns::Value,_(anonymous_namespace)::ns::ValueHash,_std::equal_to<(anonymous_namespace)::ns::Value>,_std::allocator<(anonymous_namespace)::ns::Value>_>_>
                *val,basic_json_visitor<char> *encoder)

{
  error_code ec_00;
  bool bVar1;
  undefined8 uVar2;
  Project<std::unordered_set<(anonymous_namespace)::ns::Value,_(anonymous_namespace)::ns::ValueHash,_std::equal_to<(anonymous_namespace)::ns::Value>,_std::allocator<(anonymous_namespace)::ns::Value>_>_>
  *in_RSI;
  basic_json_visitor<char> *in_RDI;
  error_code ec;
  error_code *in_stack_ffffffffffffff78;
  error_code *in_stack_ffffffffffffff80;
  ser_error *this;
  undefined1 local_20 [16];
  Project<std::unordered_set<(anonymous_namespace)::ns::Value,_(anonymous_namespace)::ns::ValueHash,_std::equal_to<(anonymous_namespace)::ns::Value>,_std::allocator<(anonymous_namespace)::ns::Value>_>_>
  *local_10;
  basic_json_visitor<char> *local_8;
  
  this = (ser_error *)local_20;
  local_10 = in_RSI;
  local_8 = in_RDI;
  std::error_code::error_code(in_stack_ffffffffffffff80);
  basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>::basic_json
            ((basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_> *)
             in_stack_ffffffffffffff80);
  encode_traits<(anonymous_namespace)::ns::Project<std::unordered_set<(anonymous_namespace)::ns::Value,(anonymous_namespace)::ns::ValueHash,std::equal_to<(anonymous_namespace)::ns::Value>,std::allocator<(anonymous_namespace)::ns::Value>>>,char,void>
  ::encode<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>>
            (local_10,local_8,
             (basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_> *)
             in_stack_ffffffffffffff80,in_stack_ffffffffffffff78);
  basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>::~basic_json
            ((basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_> *)0xd0791e);
  bVar1 = std::error_code::operator_cast_to_bool((error_code *)local_20);
  if (!bVar1) {
    basic_json_visitor<char>::flush((basic_json_visitor<char> *)0xd079b7);
    return;
  }
  uVar2 = __cxa_allocate_exception(0x58);
  ec_00._M_cat = (error_category *)local_20._8_8_;
  ec_00._0_8_ = local_20._0_8_;
  ser_error::ser_error(this,ec_00);
  __cxa_throw(uVar2,&ser_error::typeinfo,ser_error::~ser_error);
}

Assistant:

void encode_json(const T& val, basic_json_visitor<CharT>& encoder)
    {
        std::error_code ec;
        encode_traits<T,CharT>::encode(val, encoder, basic_json<CharT>(), ec);
        if (JSONCONS_UNLIKELY(ec))
        {
            JSONCONS_THROW(ser_error(ec));
        }
        encoder.flush();
    }